

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h261.c
# Opt level: O1

int h261_picparm(bitstream *str,h261_picparm *picparm)

{
  int iVar1;
  uint32_t pei;
  uint32_t local_1c;
  
  iVar1 = vs_u(str,&picparm->tr,5);
  if (iVar1 == 0) {
    iVar1 = vs_u(str,&picparm->ptype,6);
    if (iVar1 == 0) {
      if ((picparm->ptype & 1) == 0) {
        h261_picparm_cold_1();
      }
      else {
        local_1c = 0;
        iVar1 = vs_u(str,&local_1c,1);
        if (iVar1 == 0) {
          do {
            if (local_1c == 0) {
              return 0;
            }
            iVar1 = vs_u(str,&local_1c,8);
          } while ((iVar1 == 0) && (iVar1 = vs_u(str,&local_1c,1), iVar1 == 0));
        }
      }
    }
  }
  return 1;
}

Assistant:

int h261_picparm(struct bitstream *str, struct h261_picparm *picparm) {
	if (vs_u(str, &picparm->tr, 5)) return 1;
	if (vs_u(str, &picparm->ptype, 6)) return 1;
	if (!(picparm->ptype & 1)) {
		fprintf(stderr, "Spare bit unset - H.263 stream?\n");
		return 1;
	}
	uint32_t pei = 0;
	if (vs_u(str, &pei, 1)) return 1;
	while (pei) {
		if (vs_u(str, &pei, 8)) return 1;
		if (vs_u(str, &pei, 1)) return 1;
	}
	return 0;
}